

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
Parser_validConnectionMapVariablesFirst_Test::TestBody
          (Parser_validConnectionMapVariablesFirst_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_98 [8];
  Message local_90 [8];
  unsigned_long local_88 [2];
  undefined1 local_78 [8];
  AssertionResult gtest_ar;
  undefined1 local_58 [8];
  ParserPtr parser;
  allocator<char> local_31;
  string local_30 [8];
  string e;
  Parser_validConnectionMapVariablesFirst_Test *this_local;
  
  e.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_30,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<model name=\"\" xmlns=\"http://www.cellml.org/cellml/2.0#\">\n  <component name=\"robert\">\n    <variable name=\"bob\" units=\"dimensionless\"/>\n  </component>\n  <component name=\"james\">\n    <variable name=\"jimbo\" units=\"dimensionless\"/>\n  </component>\n  <connection component_1=\"robert\" component_2=\"james\">\n    <map_variables variable_2=\"jimbo\" variable_1=\"bob\"/>\n  </connection>\n</model>\n"
             ,&local_31);
  std::allocator<char>::~allocator(&local_31);
  libcellml::Parser::create
            (SUB81((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)local_58,0));
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_58);
  libcellml::Parser::parseModel((string *)&gtest_ar.message_);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)&gtest_ar.message_)
  ;
  local_88[1] = 0;
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_58);
  local_88[0] = libcellml::Logger::issueCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_78,"size_t(0)","parser->issueCount()",local_88 + 1,local_88);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(local_90);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
    testing::internal::AssertHelper::AssertHelper
              (local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/parser/parser.cpp"
               ,0x4ea,pcVar2);
    testing::internal::AssertHelper::operator=(local_98,local_90);
    testing::internal::AssertHelper::~AssertHelper(local_98);
    testing::Message::~Message(local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  std::shared_ptr<libcellml::Parser>::~shared_ptr((shared_ptr<libcellml::Parser> *)local_58);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

TEST(Parser, validConnectionMapVariablesFirst)
{
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model name=\"\" xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component name=\"robert\">\n"
        "    <variable name=\"bob\" units=\"dimensionless\"/>\n"
        "  </component>\n"
        "  <component name=\"james\">\n"
        "    <variable name=\"jimbo\" units=\"dimensionless\"/>\n"
        "  </component>\n"
        "  <connection component_1=\"robert\" component_2=\"james\">\n"
        "    <map_variables variable_2=\"jimbo\" variable_1=\"bob\"/>\n"
        "  </connection>\n"
        "</model>\n";

    libcellml::ParserPtr parser = libcellml::Parser::create();
    parser->parseModel(e);
    EXPECT_EQ(size_t(0), parser->issueCount());
}